

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_proj.c
# Opt level: O3

int cvAccessProjMem(void *cvode_mem,char *fname,CVodeMem *cv_mem,CVodeProjMem *proj_mem)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar1 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x1b6;
  }
  else {
    *cv_mem = (CVodeMem)cvode_mem;
    if (*(CVodeProjMem *)((long)cvode_mem + 0x5e0) != (CVodeProjMem)0x0) {
      *proj_mem = *(CVodeProjMem *)((long)cvode_mem + 0x5e0);
      return 0;
    }
    msgfmt = "proj_mem = NULL illegal.";
    iVar1 = -0x1d;
    error_code = -0x1d;
    line = 0x1be;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,fname,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_proj.c"
                 ,msgfmt);
  return iVar1;
}

Assistant:

static int cvAccessProjMem(void* cvode_mem, const char* fname, CVodeMem* cv_mem,
                           CVodeProjMem* proj_mem)
{
  /* Access cvode memory */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, fname, __FILE__, MSG_CV_MEM_NULL);
    return (CV_MEM_NULL);
  }
  *cv_mem = (CVodeMem)cvode_mem;

  /* Access projection memory */
  if ((*cv_mem)->proj_mem == NULL)
  {
    cvProcessError(*cv_mem, CV_PROJ_MEM_NULL, __LINE__, fname, __FILE__,
                   MSG_CV_PROJ_MEM_NULL);
    return (CV_PROJ_MEM_NULL);
  }
  *proj_mem = (CVodeProjMem)(*cv_mem)->proj_mem;

  return (CV_SUCCESS);
}